

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O0

pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> * __thiscall
vmips::Function::branch<vmips::ble,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>&>
          (pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>
           *__return_storage_ptr__,Function *this,shared_ptr<vmips::VirtReg> *args,
          shared_ptr<vmips::VirtReg> *args_1)

{
  bool bVar1;
  element_type *peVar2;
  reference __b;
  string local_b8 [32];
  string local_98 [35];
  undefined1 local_75;
  string local_68 [8];
  string b;
  string local_48 [8];
  string a;
  shared_ptr<vmips::VirtReg> *args_local_1;
  shared_ptr<vmips::VirtReg> *args_local;
  Function *this_local;
  pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> *ret;
  
  vmips::Function::next_name_abi_cxx11_();
  vmips::Function::next_name_abi_cxx11_();
  local_75 = 0;
  peVar2 = std::__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(this + 0x148));
  std::__cxx11::string::string(local_98,local_48);
  std::__cxx11::string::string(local_b8,local_68);
  CFGNode::branch<vmips::ble,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>&>
            (__return_storage_ptr__,peVar2,(string *)local_98,(string *)local_b8,args,args_1);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  __b = std::
        vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
        back((vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
              *)(this + 0x130));
  bVar1 = std::operator!=((shared_ptr<vmips::CFGNode> *)(this + 0x148),__b);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(this + 0x148));
    CFGNode::branch_existing<vmips::j>(peVar2,&__return_storage_ptr__->first);
  }
  std::vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
  push_back((vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
             *)(this + 0x130),&__return_storage_ptr__->first);
  std::vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
  push_back((vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
             *)(this + 0x130),&__return_storage_ptr__->second);
  vmips::Function::switch_to(this);
  local_75 = 1;
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<CFGNode>, std::shared_ptr<CFGNode>> branch(Args &&... args) {
            auto a = next_name();
            auto b = next_name();
            auto ret = cursor->template branch<Instr, Args...>(a, b, std::forward<Args>(args)...);
            if (cursor != blocks.back()) cursor->branch_existing<vmips::j>(ret.first);
            blocks.push_back(ret.first);
            blocks.push_back(ret.second);
            switch_to(ret.first);
            return ret;
        }